

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O1

bool __thiscall ON_Brep::IsValidLoopTopology(ON_Brep *this,int loop_index,ON_TextLog *text_log)

{
  int iVar1;
  uint uVar2;
  ON_BrepLoop *pOVar3;
  ON_BrepTrim *pOVar4;
  uint *puVar5;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong local_48;
  
  uVar6 = (ulong)(uint)loop_index;
  if ((loop_index < 0) ||
     ((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count <=
      loop_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      uVar8 = (ulong)(uint)(this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                           super_ON_ClassArray<ON_BrepLoop>.m_count;
      pcVar10 = "brep loop_index = %d (should be >=0 and <%d=brep.m_L.Count() ).\n";
      goto LAB_0040d329;
    }
  }
  else {
    pOVar3 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    if (pOVar3[uVar6].m_loop_index == loop_index) {
      if (pOVar3[uVar6].m_brep == this) {
        iVar1 = pOVar3[uVar6].m_fi;
        uVar8 = (ulong)iVar1;
        if (((long)uVar8 < 0) ||
           ((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count
            <= iVar1)) {
          if (text_log != (ON_TextLog *)0x0) {
            pcVar10 = "ON_Brep.m_L[%d].m_fi = %d is not invalid.\n";
LAB_0040d329:
            ON_TextLog::Print(text_log,pcVar10,uVar6,uVar8);
            return false;
          }
        }
        else if ((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a
                 [uVar8].m_face_index == iVar1) {
          uVar8 = (ulong)pOVar3[uVar6].m_ti.m_count;
          if ((long)uVar8 < 1) {
            if (text_log != (ON_TextLog *)0x0) {
              pcVar10 = "ON_Brep.m_L[%d].m_ti.Count() = %d  (should be > 0 )\n";
              goto LAB_0040d329;
            }
          }
          else {
            pOVar4 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                     m_a;
            uVar13 = 0;
            do {
              uVar12 = pOVar3[uVar6].m_ti.m_a[uVar13];
              lVar11 = (long)(int)uVar12;
              if ((lVar11 < 0) ||
                 ((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                  m_count <= (int)uVar12)) {
                if (text_log == (ON_TextLog *)0x0) {
                  return false;
                }
                pcVar10 = "ON_Brep.m_L[%d].m_ti[%d] = %d is not invalid.\n";
LAB_0040d58b:
                ON_TextLog::Print(text_log,pcVar10,uVar6,uVar13 & 0xffffffff,(ulong)uVar12);
                return false;
              }
              if (pOVar4[lVar11].m_trim_index != uVar12) {
                if (text_log == (ON_TextLog *)0x0) {
                  return false;
                }
                pcVar10 = "ON_Brep.m_L[%d].m_ti[%d] = %d is a deleted trim.\n";
                goto LAB_0040d58b;
              }
              if (pOVar4[lVar11].m_li != loop_index) {
                if (text_log == (ON_TextLog *)0x0) {
                  return false;
                }
                ON_TextLog::Print(text_log,"brep loop m_L[%d] or trim m_T[%d] is not valid.\n",uVar6
                                  ,(ulong)uVar12);
                ON_TextLog::PushIndent(text_log);
                ON_TextLog::Print(text_log,"loop.m_ti[%d] = %d != %d =trim.m_li\n",
                                  uVar13 & 0xffffffff,(ulong)uVar12,(ulong)(uint)pOVar4[lVar11].m_li
                                 );
                goto LAB_0040d373;
              }
              uVar13 = uVar13 + 1;
            } while (uVar8 != uVar13);
            if (pOVar3[uVar6].m_ti.m_count < 1) {
              uVar9 = 0xfffffff7;
              uVar12 = 0xfffffffe;
              local_48 = 0xfffffffd;
              uVar8 = 0xfffffffc;
            }
            else {
              uVar8 = 0xfffffffc;
              local_48 = 0xfffffffd;
              uVar12 = 0xfffffffe;
              uVar9 = 0xfffffff7;
              uVar13 = 0;
              do {
                puVar5 = (uint *)pOVar3[uVar6].m_ti.m_a;
                uVar2 = puVar5[uVar13];
                pOVar4 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                         super_ON_ClassArray<ON_BrepTrim>.m_a;
                if (uVar13 == 0) {
                  uVar8 = (ulong)*puVar5;
                  local_48 = (ulong)(uint)pOVar4[(int)uVar2].m_vi[0];
LAB_0040d4f8:
                  uVar12 = pOVar4[(int)uVar2].m_vi[1];
                  bVar7 = true;
                  uVar9 = uVar2;
                }
                else {
                  if (uVar12 == pOVar4[(int)uVar2].m_vi[0]) goto LAB_0040d4f8;
                  if (text_log == (ON_TextLog *)0x0) {
                    bVar7 = false;
                  }
                  else {
                    ON_TextLog::Print(text_log,"brep loop m_L[%d] is not valid.\n",uVar6);
                    ON_TextLog::PushIndent(text_log);
                    ON_TextLog::Print(text_log,
                                      "m_T[loop.m_ti[%d]=%d].m_vi[1] = %d != m_T[loop.m_ti[%d]=%d].m_vi[0]=%d.\n"
                                      ,(ulong)((int)uVar13 - 1),(ulong)uVar9,(ulong)uVar12,
                                      uVar13 & 0xffffffff,
                                      (ulong)(uint)pOVar3[uVar6].m_ti.m_a[uVar13],
                                      (ulong)(uint)pOVar4[(int)uVar2].m_vi[0]);
                    ON_TextLog::PopIndent(text_log);
                    bVar7 = false;
                  }
                }
                if (!bVar7) {
                  return false;
                }
                uVar13 = uVar13 + 1;
              } while ((long)uVar13 < (long)pOVar3[uVar6].m_ti.m_count);
            }
            if ((int)uVar8 < 0) {
              return true;
            }
            if ((uint)local_48 == uVar12) {
              return true;
            }
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"brep loop m_L[%d] is not valid.\n",uVar6);
              ON_TextLog::PushIndent(text_log);
              ON_TextLog::Print(text_log,
                                "m_T[loop.m_ti[%d]=%d].m_vi[1] = %d != m_T[loop.m_ti[0]=%d].m_vi[0]=%d.\n"
                                ,(ulong)(pOVar3[uVar6].m_ti.m_count - 1),(ulong)uVar9,(ulong)uVar12,
                                uVar8,local_48);
              goto LAB_0040d373;
            }
          }
        }
        else if (text_log != (ON_TextLog *)0x0) {
          pcVar10 = "ON_Brep.m_L[%d].m_fi = %d is a deleted face.\n";
          goto LAB_0040d329;
        }
      }
      else if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_L[%d] loop is not valid.\n",uVar6);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"loop.m_brep does not point to parent brep\n");
        goto LAB_0040d373;
      }
    }
    else if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_L[%d] loop is not valid.\n",uVar6);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"loop.m_loop_index = %d (should be %d).\n",
                        (ulong)(uint)pOVar3[uVar6].m_loop_index,uVar6);
LAB_0040d373:
      ON_TextLog::PopIndent(text_log);
      return false;
    }
  }
  return false;
}

Assistant:

bool
ON_Brep::IsValidLoopTopology( int loop_index, ON_TextLog* text_log ) const
{
  int lti, ti;

  if ( loop_index < 0 || loop_index >= m_L.Count() )
  {
    if ( text_log )
      text_log->Print("brep loop_index = %d (should be >=0 and <%d=brep.m_L.Count() ).\n",
                      loop_index, m_L.Count());
    return false;
  }
  const ON_BrepLoop& loop = m_L[loop_index];
  if ( loop.m_loop_index != loop_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_L[%d] loop is not valid.\n",loop_index);
      text_log->PushIndent();
      text_log->Print("loop.m_loop_index = %d (should be %d).\n",
                       loop.m_loop_index, loop_index );
      text_log->PopIndent();
    }
    return false;
  }
  if ( loop.m_brep != this )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_L[%d] loop is not valid.\n",loop_index);
      text_log->PushIndent();
      text_log->Print("loop.m_brep does not point to parent brep\n");
      text_log->PopIndent();
    }
    return false;
  }

  if ( loop.m_fi < 0 || loop.m_fi >= m_F.Count() )
  {
    if ( text_log )
      text_log->Print("ON_Brep.m_L[%d].m_fi = %d is not invalid.\n",loop_index,loop.m_fi);
    return false;
  }
  if ( m_F[loop.m_fi].m_face_index != loop.m_fi )
  {
    if ( text_log )
      text_log->Print("ON_Brep.m_L[%d].m_fi = %d is a deleted face.\n",loop_index,loop.m_fi);
    return false;
  }
  if ( loop.m_ti.Count() < 1 )
  {
      if ( text_log )
        text_log->Print("ON_Brep.m_L[%d].m_ti.Count() = %d  (should be > 0 )\n",loop_index,loop.m_ti.Count());
      return false;
  }

  for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
  {
    ti = loop.m_ti[lti];
    if ( ti < 0 || ti >= m_T.Count() )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_L[%d].m_ti[%d] = %d is not invalid.\n",loop_index,lti,ti);
      return false;
    }
    const ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_trim_index != ti )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_L[%d].m_ti[%d] = %d is a deleted trim.\n",loop_index,lti,ti);
      return false;
    }
    if ( trim.m_li != loop_index )
    {
      if ( text_log )
      {
        text_log->Print("brep loop m_L[%d] or trim m_T[%d] is not valid.\n",loop_index,ti);
        text_log->PushIndent();
        text_log->Print("loop.m_ti[%d] = %d != %d =trim.m_li\n",lti,ti,trim.m_li);
        text_log->PopIndent();
      }
      return false;
    }
  }


  int first_trim_ti = -4;
  int first_trim_vi0 = -3;
  int prev_trim_vi1 = -2;
  int prev_trim_ti=-9;
  for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
  {
    const ON_BrepTrim& trim = m_T[loop.m_ti[lti]];
    if ( 0 == lti )
    {
      first_trim_ti = loop.m_ti[lti];
      first_trim_vi0 = trim.m_vi[0];
    }
    else if ( prev_trim_vi1 != trim.m_vi[0] )
    {
      // 23 May 2003 Dale Lear
      //     Added this test to make sure adjacent trims
      //     in a loop shared vertices.
      if ( text_log )
      {
         text_log->Print("brep loop m_L[%d] is not valid.\n",loop_index);
         text_log->PushIndent();
         text_log->Print("m_T[loop.m_ti[%d]=%d].m_vi[1] = %d != m_T[loop.m_ti[%d]=%d].m_vi[0]=%d.\n",
                          lti-1,prev_trim_ti,prev_trim_vi1,lti,loop.m_ti[lti],trim.m_vi[0]);
         text_log->PopIndent();
      }
      return false;
    }
    prev_trim_ti = loop.m_ti[lti];
    prev_trim_vi1 = trim.m_vi[1];
  }

  if ( first_trim_ti >= 0 && first_trim_vi0 != prev_trim_vi1 )
  {
    // 23 May 2003 Dale Lear
    //     Added this test to make sure adjacent trims
    //     in a loop shared vertices.
    if ( text_log )
    {
       text_log->Print("brep loop m_L[%d] is not valid.\n",loop_index);
       text_log->PushIndent();
       text_log->Print("m_T[loop.m_ti[%d]=%d].m_vi[1] = %d != m_T[loop.m_ti[0]=%d].m_vi[0]=%d.\n",
                        loop.m_ti.Count()-1,prev_trim_ti,prev_trim_vi1,first_trim_ti,first_trim_vi0);
       text_log->PopIndent();
    }
    return false;
  }


  return true;
}